

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

void WriteVectorToFile<int>(FILE *file_ptr,vector<int,_std::allocator<int>_> *vec)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  size_t len;
  size_t in_stack_00000110;
  char *in_stack_00000118;
  FILE *in_stack_00000120;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea0;
  string *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int line;
  string *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  allocator *paVar4;
  LogSeverity severity;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Logger local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  vector<int,_std::allocator<int>_> *local_10;
  
  severity = (LogSeverity)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  line = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  if (in_RDI == 0) {
    Logger::Logger(&local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_39);
    paVar4 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"WriteVectorToFile",paVar4);
    poVar2 = Logger::Start((LogSeverity)((ulong)paVar4 >> 0x20),in_stack_ffffffffffffff18,line,
                           in_stack_ffffffffffffff08);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x10f);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"file_ptr");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)in_stack_fffffffffffffea0);
    abort();
  }
  local_10 = in_RSI;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffea0);
  if (!bVar1) {
    std::vector<int,_std::allocator<int>_>::size(local_10);
    WriteDataToDisk(in_stack_00000120,in_stack_00000118,in_stack_00000110);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x1440f8);
    WriteDataToDisk(in_stack_00000120,in_stack_00000118,in_stack_00000110);
    return;
  }
  Logger::Logger(&local_78,ERR);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
             ,&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"WriteVectorToFile",&local_c1);
  poVar2 = Logger::Start(severity,in_stack_ffffffffffffff18,line,in_stack_ffffffffffffff08);
  poVar2 = std::operator<<(poVar2,"CHECK failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x111);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"!vec.empty()");
  poVar3 = std::operator<<(poVar2," = ");
  bVar1 = std::vector<int,_std::allocator<int>_>::empty((vector<int,_std::allocator<int>_> *)poVar2)
  ;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,!bVar1);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Logger::~Logger((Logger *)poVar2);
  abort();
}

Assistant:

void WriteVectorToFile(FILE *file_ptr, const std::vector<T> &vec) {
  CHECK_NOTNULL(file_ptr);
  // We do not want to serialize an empty vector
  CHECK(!vec.empty());
  size_t len = vec.size();
  // First, write the length of this vector
  WriteDataToDisk(file_ptr, reinterpret_cast<char *>(&len), sizeof(len));
  // Then, write the data of this vector
  WriteDataToDisk(file_ptr, (char *)(vec.data()), sizeof(T)*len);
}